

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObserverPtr.cpp
# Opt level: O3

void Rml::Detail::DeallocateObserverPtrBlockIfEmpty(ObserverPtrBlock *block)

{
  long lVar1;
  void *pvVar2;
  code *pcVar3;
  char *pcVar4;
  bool bVar5;
  int iVar6;
  long *plVar7;
  
  iVar6 = block->num_observers;
  if (iVar6 < 0) {
    bVar5 = Assert("RMLUI_ASSERT(block->num_observers >= 0)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ObserverPtr.cpp"
                   ,0x2a);
    if (!bVar5) goto LAB_0024a192;
    iVar6 = block->num_observers;
  }
  pcVar4 = observer_ptr_data;
  if ((iVar6 == 0) && (block->pointed_to_object == (void *)0x0)) {
    *(int *)(observer_ptr_data + 0x28) = *(int *)(observer_ptr_data + 0x28) + -1;
    lVar1 = *(long *)(block + 1);
    pvVar2 = block[1].pointed_to_object;
    if (lVar1 == 0) {
      plVar7 = (long *)(pcVar4 + 0x18);
      if (*(ObserverPtrBlock **)(pcVar4 + 0x18) != block) {
        bVar5 = Assert("RMLUI_ASSERT(first_allocated_node == object)",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Pool.inl"
                       ,0xa5);
        if (!bVar5) {
LAB_0024a192:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
      }
    }
    else {
      plVar7 = (long *)(lVar1 + 0x18);
    }
    *plVar7 = (long)pvVar2;
    if (pvVar2 != (void *)0x0) {
      *(long *)((long)pvVar2 + 0x10) = lVar1;
    }
    pvVar2 = *(void **)(pcVar4 + 0x20);
    *(undefined8 *)(block + 1) = 0;
    block[1].pointed_to_object = pvVar2;
    *(ObserverPtrBlock **)(pcVar4 + 0x20) = block;
    pcVar4 = observer_ptr_data;
    if ((*observer_ptr_data == '\x01') && (*(int *)(observer_ptr_data + 0x28) == 0)) {
      Pool<Rml::Detail::ObserverPtrBlock>::~Pool
                ((Pool<Rml::Detail::ObserverPtrBlock> *)(observer_ptr_data + 8));
      operator_delete(pcVar4,0x30);
      observer_ptr_data = (char *)0x0;
    }
  }
  return;
}

Assistant:

void Detail::DeallocateObserverPtrBlockIfEmpty(ObserverPtrBlock* block)
{
	RMLUI_ASSERT(block->num_observers >= 0);
	if (block->num_observers == 0 && block->pointed_to_object == nullptr)
	{
		observer_ptr_data->block_pool.DestroyAndDeallocate(block);
		if (observer_ptr_data->is_shutdown && observer_ptr_data->block_pool.GetNumAllocatedObjects() == 0)
		{
			delete observer_ptr_data;
			observer_ptr_data = nullptr;
		}
	}
}